

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  CURLcode CVar1;
  int query_00;
  curltime *when;
  Curl_cfilter *pCVar2;
  curltime cVar3;
  
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 5) {
      pCVar2 = (Curl_cfilter *)cf->ctx;
      query_00 = 5;
    }
    else {
      if (query != 4) goto LAB_00151a01;
      pCVar2 = (Curl_cfilter *)cf->ctx;
      query_00 = 4;
    }
    cVar3 = cf_get_max_baller_time(pCVar2,data,query_00);
    *(time_t *)pres2 = cVar3.tv_sec;
    *(int *)((long)pres2 + 8) = cVar3.tv_usec;
    CVar1 = CURLE_OK;
  }
  else {
LAB_00151a01:
    pCVar2 = cf->next;
    if (pCVar2 != (Curl_cfilter *)0x0) {
      CVar1 = (*pCVar2->cft->query)(pCVar2,data,query,pres1,pres2);
      return CVar1;
    }
    CVar1 = CURLE_UNKNOWN_OPTION;
  }
  return CVar1;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}